

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86_avx::forward
          (BinaryOp_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Mat *pMVar4;
  undefined1 auVar5 [32];
  bool bVar6;
  bool bVar7;
  uint uVar8;
  Mat *m;
  float *pfVar9;
  int iVar10;
  undefined1 (*pauVar11) [32];
  Option *opt_00;
  undefined1 (*pauVar12) [32];
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  Mat *b;
  long lVar17;
  float *pfVar18;
  float fVar19;
  float fVar20;
  float fVar22;
  float fVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar21 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar39 [64];
  float in_register_000012dc;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float in_register_0000131c;
  undefined1 auVar47 [16];
  __m128 afVar48;
  binary_op_ratan2 op;
  __m128 _b;
  __m256 _b_avx;
  binary_op_ratan2 local_135;
  int local_134;
  long local_130;
  long local_128;
  Mat *local_120;
  Mat *local_118;
  float local_110 [2];
  float afStack_108 [2];
  float local_100 [2];
  float afStack_f8 [2];
  float afStack_f0 [2];
  float afStack_e8 [6];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  float afStack_b0 [2];
  float afStack_a8 [2];
  undefined1 local_a0 [32];
  float local_80 [2];
  float afStack_78 [2];
  float afStack_70 [2];
  float afStack_68 [14];
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  b = pMVar4 + 1;
  iVar10 = pMVar4[1].h * pMVar4[1].w * pMVar4[1].d * pMVar4[1].c * pMVar4[1].elempack;
  if (((pMVar4->dims < pMVar4[1].dims) && (iVar10 != 1)) ||
     (pMVar4->c * pMVar4->elempack * pMVar4->d * pMVar4->h * pMVar4->w < iVar10)) {
    uVar8 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx[-3]);
    switch(uVar8) {
    case 1:
      uVar8 = 7;
      break;
    case 3:
      uVar8 = 8;
      break;
    case 6:
      uVar8 = 9;
      break;
    case 7:
      uVar8 = 1;
      break;
    case 8:
      uVar8 = 3;
      break;
    case 9:
      uVar8 = 6;
      break;
    case 10:
      uVar8 = 0xb;
      break;
    case 0xb:
      uVar8 = 10;
    }
    m = b;
    b = pMVar4;
  }
  else {
    uVar8 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx[-3]);
    m = pMVar4;
  }
  pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create_like(pMVar4,m,opt->blob_allocator);
  if (pMVar4->data == (void *)0x0) {
    return -100;
  }
  if ((long)pMVar4->c * pMVar4->cstep == 0) {
    return -100;
  }
  uVar16 = b->elempack;
  opt_00 = (Option *)(ulong)uVar16;
  uVar15 = b->w;
  iVar10 = b->h;
  iVar13 = b->d;
  iVar1 = b->c;
  if (iVar13 * iVar1 * iVar10 * uVar15 * uVar16 == 1) {
    if (0xb < uVar8) {
      return 0;
    }
    fVar20 = *b->data;
    local_d0 = ZEXT416((uint)fVar20);
    auVar21 = ZEXT416((uint)fVar20);
    auVar47 = ZEXT416((uint)fVar20);
    local_120 = pMVar4;
    local_118 = m;
    switch(uVar8) {
    case 1:
      iVar10 = m->c;
      if ((long)iVar10 < 1) {
        return 0;
      }
      uVar8 = m->h * m->w * m->d * m->elempack;
      auVar47 = vshufps_avx(auVar21,auVar47,0);
      auVar30._16_16_ = auVar47;
      auVar30._0_16_ = auVar47;
      lVar17 = 0;
      do {
        pauVar11 = (undefined1 (*) [32])(m->cstep * lVar17 * m->elemsize + (long)m->data);
        pauVar12 = (undefined1 (*) [32])
                   (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar8 < 8) {
          uVar16 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar32 = vsubps_avx(*pauVar11,auVar30);
            *pauVar12 = auVar32;
            pauVar11 = pauVar11 + 1;
            pauVar12 = pauVar12 + 1;
            iVar13 = iVar13 + 8;
            uVar16 = uVar8 & 0xfffffff8;
          } while (iVar13 < (int)uVar8);
        }
        uVar15 = uVar16 | 3;
        while ((int)uVar15 < (int)uVar8) {
          auVar21 = vsubps_avx(*(undefined1 (*) [16])*pauVar11,auVar47);
          *(undefined1 (*) [16])*pauVar12 = auVar21;
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          pauVar12 = (undefined1 (*) [32])((long)*pauVar12 + 0x10);
          uVar15 = uVar16 + 7;
          uVar16 = uVar16 + 4;
        }
        if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
          lVar14 = 0;
          do {
            *(float *)((long)*pauVar12 + lVar14 * 4) = *(float *)(*pauVar11 + lVar14 * 4) - fVar20;
            lVar14 = lVar14 + 1;
          } while (uVar8 - uVar16 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar10);
      return 0;
    case 2:
      iVar10 = m->c;
      if ((long)iVar10 < 1) {
        return 0;
      }
      uVar8 = m->h * m->w * m->d * m->elempack;
      auVar47 = vshufps_avx(auVar21,auVar21,0);
      lVar17 = 0;
      do {
        pfVar9 = (float *)(m->cstep * lVar17 * m->elemsize + (long)m->data);
        pauVar11 = (undefined1 (*) [32])
                   (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
        fVar19 = auVar47._0_4_;
        fVar22 = auVar47._4_4_;
        fVar23 = auVar47._8_4_;
        if ((int)uVar8 < 8) {
          uVar16 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar39._0_4_ = fVar19 * *pfVar9;
            auVar39._4_4_ = fVar22 * pfVar9[1];
            auVar39._8_4_ = fVar23 * pfVar9[2];
            auVar39._12_4_ = auVar47._12_4_ * pfVar9[3];
            auVar39._16_4_ = fVar19 * pfVar9[4];
            auVar39._20_4_ = fVar22 * pfVar9[5];
            auVar39._28_36_ = in_ZMM2._28_36_;
            auVar39._24_4_ = fVar23 * pfVar9[6];
            in_ZMM2 = ZEXT3264(auVar39._0_32_);
            *pauVar11 = auVar39._0_32_;
            pfVar9 = pfVar9 + 8;
            pauVar11 = pauVar11 + 1;
            iVar13 = iVar13 + 8;
            uVar16 = uVar8 & 0xfffffff8;
          } while (iVar13 < (int)uVar8);
        }
        uVar15 = uVar16 | 3;
        while ((int)uVar15 < (int)uVar8) {
          auVar34._0_4_ = fVar19 * *pfVar9;
          auVar34._4_4_ = fVar22 * pfVar9[1];
          auVar34._8_4_ = fVar23 * pfVar9[2];
          auVar34._12_4_ = auVar47._12_4_ * pfVar9[3];
          in_ZMM2 = ZEXT1664(auVar34);
          *(undefined1 (*) [16])*pauVar11 = auVar34;
          pfVar9 = pfVar9 + 4;
          pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 0x10);
          uVar15 = uVar16 + 7;
          uVar16 = uVar16 + 4;
        }
        if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
          lVar14 = 0;
          do {
            in_ZMM2 = ZEXT464((uint)(fVar20 * pfVar9[lVar14]));
            *(float *)((long)*pauVar11 + lVar14 * 4) = fVar20 * pfVar9[lVar14];
            lVar14 = lVar14 + 1;
          } while (uVar8 - uVar16 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar10);
      return 0;
    case 3:
      iVar10 = m->c;
      if ((long)iVar10 < 1) {
        return 0;
      }
      uVar8 = m->h * m->w * m->d * m->elempack;
      auVar21._0_4_ = 1.0 / fVar20;
      auVar21._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar47 = vshufps_avx(auVar21,auVar21,0);
      lVar17 = 0;
      do {
        pfVar9 = (float *)(m->cstep * lVar17 * m->elemsize + (long)m->data);
        pfVar18 = (float *)(pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
        fVar20 = auVar47._0_4_;
        fVar19 = auVar47._4_4_;
        fVar22 = auVar47._8_4_;
        if ((int)uVar8 < 8) {
          uVar16 = 0;
        }
        else {
          iVar13 = 7;
          do {
            fVar23 = pfVar9[1];
            fVar40 = pfVar9[2];
            fVar41 = pfVar9[3];
            fVar42 = pfVar9[4];
            fVar43 = pfVar9[5];
            fVar44 = pfVar9[6];
            *pfVar18 = fVar20 * *pfVar9;
            pfVar18[1] = fVar19 * fVar23;
            pfVar18[2] = fVar22 * fVar40;
            pfVar18[3] = auVar47._12_4_ * fVar41;
            pfVar18[4] = fVar20 * fVar42;
            pfVar18[5] = fVar19 * fVar43;
            pfVar18[6] = fVar22 * fVar44;
            pfVar18[7] = in_register_000012dc;
            pfVar9 = pfVar9 + 8;
            pfVar18 = pfVar18 + 8;
            iVar13 = iVar13 + 8;
            uVar16 = uVar8 & 0xfffffff8;
          } while (iVar13 < (int)uVar8);
        }
        uVar15 = uVar16 | 3;
        while ((int)uVar15 < (int)uVar8) {
          fVar23 = pfVar9[1];
          fVar40 = pfVar9[2];
          fVar41 = pfVar9[3];
          in_register_000012dc = 0.0;
          *pfVar18 = fVar20 * *pfVar9;
          pfVar18[1] = fVar19 * fVar23;
          pfVar18[2] = fVar22 * fVar40;
          pfVar18[3] = auVar47._12_4_ * fVar41;
          pfVar9 = pfVar9 + 4;
          pfVar18 = pfVar18 + 4;
          uVar15 = uVar16 + 7;
          uVar16 = uVar16 + 4;
        }
        if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
          lVar14 = 0;
          do {
            in_register_000012dc = 0.0;
            pfVar18[lVar14] = auVar21._0_4_ * pfVar9[lVar14];
            lVar14 = lVar14 + 1;
          } while (uVar8 - uVar16 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar10);
      return 0;
    case 4:
      iVar10 = m->c;
      if ((long)iVar10 < 1) {
        return 0;
      }
      uVar8 = m->h * m->w * m->d * m->elempack;
      auVar47 = vshufps_avx(auVar47,auVar47,0);
      auVar28._16_16_ = auVar47;
      auVar28._0_16_ = auVar47;
      lVar17 = 0;
      do {
        pauVar11 = (undefined1 (*) [32])(m->cstep * lVar17 * m->elemsize + (long)m->data);
        pauVar12 = (undefined1 (*) [32])
                   (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar8 < 8) {
          uVar16 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar32 = vmaxps_avx(auVar28,*pauVar11);
            *pauVar12 = auVar32;
            pauVar11 = pauVar11 + 1;
            pauVar12 = pauVar12 + 1;
            iVar13 = iVar13 + 8;
            uVar16 = uVar8 & 0xfffffff8;
          } while (iVar13 < (int)uVar8);
        }
        uVar15 = uVar16 | 3;
        while ((int)uVar15 < (int)uVar8) {
          auVar34 = vmaxps_avx(auVar47,*(undefined1 (*) [16])*pauVar11);
          *(undefined1 (*) [16])*pauVar12 = auVar34;
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          pauVar12 = (undefined1 (*) [32])((long)*pauVar12 + 0x10);
          uVar15 = uVar16 + 7;
          uVar16 = uVar16 + 4;
        }
        if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
          lVar14 = 0;
          do {
            auVar34 = vmaxss_avx(auVar21,ZEXT416(*(uint *)(*pauVar11 + lVar14 * 4)));
            *(int *)((long)*pauVar12 + lVar14 * 4) = auVar34._0_4_;
            lVar14 = lVar14 + 1;
          } while (uVar8 - uVar16 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar10);
      return 0;
    case 5:
      iVar10 = m->c;
      if ((long)iVar10 < 1) {
        return 0;
      }
      uVar8 = m->h * m->w * m->d * m->elempack;
      auVar21 = vshufps_avx(auVar21,auVar47,0);
      auVar31._16_16_ = auVar21;
      auVar31._0_16_ = auVar21;
      lVar17 = 0;
      do {
        pauVar11 = (undefined1 (*) [32])(m->cstep * lVar17 * m->elemsize + (long)m->data);
        pauVar12 = (undefined1 (*) [32])
                   (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar8 < 8) {
          uVar16 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar32 = vminps_avx(auVar31,*pauVar11);
            *pauVar12 = auVar32;
            pauVar11 = pauVar11 + 1;
            pauVar12 = pauVar12 + 1;
            iVar13 = iVar13 + 8;
            uVar16 = uVar8 & 0xfffffff8;
          } while (iVar13 < (int)uVar8);
        }
        uVar15 = uVar16 | 3;
        while ((int)uVar15 < (int)uVar8) {
          auVar34 = vminps_avx(auVar21,*(undefined1 (*) [16])*pauVar11);
          *(undefined1 (*) [16])*pauVar12 = auVar34;
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          pauVar12 = (undefined1 (*) [32])((long)*pauVar12 + 0x10);
          uVar15 = uVar16 + 7;
          uVar16 = uVar16 + 4;
        }
        if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
          lVar14 = 0;
          do {
            auVar34 = vminss_avx(auVar47,ZEXT416(*(uint *)(*pauVar11 + lVar14 * 4)));
            *(int *)((long)*pauVar12 + lVar14 * 4) = auVar34._0_4_;
            lVar14 = lVar14 + 1;
          } while (uVar8 - uVar16 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar10);
      return 0;
    case 6:
      local_130 = (long)m->c;
      if (local_130 < 1) {
        return 0;
      }
      local_134 = m->h * m->w * m->d * m->elempack;
      auVar47 = vshufps_avx(auVar21,auVar21,0);
      local_a0 = ZEXT1632(auVar47);
      register0x00001210 = auVar47;
      local_c0 = auVar47;
      local_128 = 0;
      do {
        auVar32 = _local_c0;
        pfVar18 = (float *)(local_118->cstep * local_128 * local_118->elemsize +
                           (long)local_118->data);
        pfVar9 = (float *)(local_120->cstep * local_128 * local_120->elemsize +
                          (long)local_120->data);
        local_80[0] = (float)local_c0._0_4_;
        local_80[1] = (float)local_c0._4_4_;
        afStack_78[0] = (float)local_c0._8_4_;
        afStack_78[1] = (float)local_c0._12_4_;
        afStack_70[0] = afStack_b0[0];
        afStack_70[1] = afStack_b0[1];
        afStack_68[0] = afStack_a8[0];
        afStack_68[1] = afStack_a8[1];
        _local_c0 = auVar32;
        if (local_134 < 8) {
          uVar8 = 0;
        }
        else {
          uVar16 = 0;
          do {
            uVar25 = *(undefined8 *)pfVar18;
            uVar24 = *(undefined8 *)(pfVar18 + 2);
            uVar26 = *(undefined8 *)(pfVar18 + 4);
            uVar27 = *(undefined8 *)(pfVar18 + 6);
            local_100 = (float  [2])uVar25;
            afStack_f8 = (float  [2])uVar24;
            afStack_f0 = (float  [2])uVar26;
            afStack_e8._0_8_ = uVar27;
            BinaryOp_x86_avx_functor::binary_op_pow::func_pack8
                      ((binary_op_pow *)&local_135,(__m256 *)local_100,(__m256 *)local_80);
            *(undefined8 *)pfVar9 = uVar25;
            *(undefined8 *)(pfVar9 + 2) = uVar24;
            *(undefined8 *)(pfVar9 + 4) = uVar26;
            *(undefined8 *)(pfVar9 + 6) = uVar27;
            pfVar18 = pfVar18 + 8;
            pfVar9 = pfVar9 + 8;
            uVar8 = uVar16 + 8;
            iVar10 = uVar16 + 0xf;
            uVar16 = uVar8;
          } while (iVar10 < local_134);
        }
        auVar32 = local_a0;
        local_100[0] = (float)local_a0._0_4_;
        local_100[1] = (float)local_a0._4_4_;
        afStack_f8[0] = (float)local_a0._8_4_;
        afStack_f8[1] = (float)local_a0._12_4_;
        local_a0 = auVar32;
        uVar16 = uVar8;
        if ((int)(uVar8 | 3) < local_134) {
          do {
            local_110 = *(float (*) [2])pfVar18;
            uVar25 = *(undefined8 *)(pfVar18 + 2);
            afStack_108 = (float  [2])uVar25;
            afVar48 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                                ((binary_op_pow *)&local_135,(__m128 *)local_110,(__m128 *)local_100
                                );
            *(long *)pfVar9 = afVar48._0_8_;
            *(undefined8 *)(pfVar9 + 2) = uVar25;
            pfVar18 = pfVar18 + 4;
            pfVar9 = pfVar9 + 4;
            uVar8 = uVar16 + 4;
            iVar10 = uVar16 + 7;
            uVar16 = uVar8;
          } while (iVar10 < local_134);
        }
        iVar10 = local_134 - uVar8;
        if ((int)uVar8 < local_134) {
          lVar17 = 0;
          do {
            fVar20 = powf(pfVar18[lVar17],local_d0._0_4_);
            pfVar9[lVar17] = fVar20;
            lVar17 = lVar17 + 1;
          } while (iVar10 != (int)lVar17);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_130);
      return 0;
    case 7:
      iVar10 = m->c;
      if ((long)iVar10 < 1) {
        return 0;
      }
      uVar8 = m->h * m->w * m->d * m->elempack;
      auVar47 = vshufps_avx(auVar21,auVar21,0);
      auVar29._16_16_ = auVar47;
      auVar29._0_16_ = auVar47;
      lVar17 = 0;
      do {
        pauVar11 = (undefined1 (*) [32])(m->cstep * lVar17 * m->elemsize + (long)m->data);
        pauVar12 = (undefined1 (*) [32])
                   (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar8 < 8) {
          uVar16 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar32 = vsubps_avx(auVar29,*pauVar11);
            *pauVar12 = auVar32;
            pauVar11 = pauVar11 + 1;
            pauVar12 = pauVar12 + 1;
            iVar13 = iVar13 + 8;
            uVar16 = uVar8 & 0xfffffff8;
          } while (iVar13 < (int)uVar8);
        }
        uVar15 = uVar16 | 3;
        while ((int)uVar15 < (int)uVar8) {
          auVar21 = vsubps_avx(auVar47,*(undefined1 (*) [16])*pauVar11);
          *(undefined1 (*) [16])*pauVar12 = auVar21;
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          pauVar12 = (undefined1 (*) [32])((long)*pauVar12 + 0x10);
          uVar15 = uVar16 + 7;
          uVar16 = uVar16 + 4;
        }
        if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
          lVar14 = 0;
          do {
            *(float *)((long)*pauVar12 + lVar14 * 4) = fVar20 - *(float *)(*pauVar11 + lVar14 * 4);
            lVar14 = lVar14 + 1;
          } while (uVar8 - uVar16 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar10);
      return 0;
    case 8:
      iVar10 = m->c;
      if ((long)iVar10 < 1) {
        return 0;
      }
      uVar8 = m->h * m->w * m->d * m->elempack;
      auVar47 = vshufps_avx(auVar21,auVar21,0);
      auVar32._16_16_ = auVar47;
      auVar32._0_16_ = auVar47;
      lVar17 = 0;
      do {
        pauVar11 = (undefined1 (*) [32])(m->cstep * lVar17 * m->elemsize + (long)m->data);
        pauVar12 = (undefined1 (*) [32])
                   (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
        fVar19 = auVar47._0_4_;
        fVar22 = auVar47._4_4_;
        fVar23 = auVar47._8_4_;
        if ((int)uVar8 < 8) {
          uVar16 = 0;
        }
        else {
          iVar13 = 7;
          do {
            auVar29 = *pauVar11;
            auVar31 = vrcpps_avx(auVar29);
            fVar40 = fVar19 * auVar31._0_4_;
            fVar41 = fVar22 * auVar31._4_4_;
            fVar42 = fVar23 * auVar31._8_4_;
            fVar43 = auVar47._12_4_ * auVar31._12_4_;
            fVar44 = fVar19 * auVar31._16_4_;
            fVar45 = fVar22 * auVar31._20_4_;
            fVar46 = fVar23 * auVar31._24_4_;
            auVar5._4_4_ = auVar29._4_4_ * fVar41;
            auVar5._0_4_ = auVar29._0_4_ * fVar40;
            auVar5._8_4_ = auVar29._8_4_ * fVar42;
            auVar5._12_4_ = auVar29._12_4_ * fVar43;
            auVar5._16_4_ = auVar29._16_4_ * fVar44;
            auVar5._20_4_ = auVar29._20_4_ * fVar45;
            auVar5._24_4_ = auVar29._24_4_ * fVar46;
            auVar5._28_4_ = auVar29._28_4_;
            auVar29 = vsubps_avx(auVar32,auVar5);
            auVar38._0_4_ = fVar40 + auVar31._0_4_ * auVar29._0_4_;
            auVar38._4_4_ = fVar41 + auVar31._4_4_ * auVar29._4_4_;
            auVar38._8_4_ = fVar42 + auVar31._8_4_ * auVar29._8_4_;
            auVar38._12_4_ = fVar43 + auVar31._12_4_ * auVar29._12_4_;
            auVar38._16_4_ = fVar44 + auVar31._16_4_ * auVar29._16_4_;
            auVar38._20_4_ = fVar45 + auVar31._20_4_ * auVar29._20_4_;
            auVar38._24_4_ = fVar46 + auVar31._24_4_ * auVar29._24_4_;
            auVar38._28_4_ = in_register_0000131c + auVar29._28_4_;
            *pauVar12 = auVar38;
            pauVar11 = pauVar11 + 1;
            pauVar12 = pauVar12 + 1;
            iVar13 = iVar13 + 8;
            uVar16 = uVar8 & 0xfffffff8;
          } while (iVar13 < (int)uVar8);
        }
        uVar15 = uVar16 | 3;
        while ((int)uVar15 < (int)uVar8) {
          auVar21 = *(undefined1 (*) [16])*pauVar11;
          auVar34 = vrcpps_avx(auVar21);
          fVar40 = fVar19 * auVar34._0_4_;
          fVar41 = fVar22 * auVar34._4_4_;
          fVar42 = fVar23 * auVar34._8_4_;
          fVar43 = auVar47._12_4_ * auVar34._12_4_;
          in_register_0000131c = 0.0;
          auVar35._0_4_ = auVar21._0_4_ * fVar40;
          auVar35._4_4_ = auVar21._4_4_ * fVar41;
          auVar35._8_4_ = auVar21._8_4_ * fVar42;
          auVar35._12_4_ = auVar21._12_4_ * fVar43;
          auVar21 = vsubps_avx(auVar47,auVar35);
          auVar36._0_4_ = fVar40 + auVar34._0_4_ * auVar21._0_4_;
          auVar36._4_4_ = fVar41 + auVar34._4_4_ * auVar21._4_4_;
          auVar36._8_4_ = fVar42 + auVar34._8_4_ * auVar21._8_4_;
          auVar36._12_4_ = fVar43 + auVar34._12_4_ * auVar21._12_4_;
          *(undefined1 (*) [16])*pauVar12 = auVar36;
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          pauVar12 = (undefined1 (*) [32])((long)*pauVar12 + 0x10);
          uVar15 = uVar16 + 7;
          uVar16 = uVar16 + 4;
        }
        if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
          lVar14 = 0;
          do {
            *(float *)((long)*pauVar12 + lVar14 * 4) = fVar20 / *(float *)(*pauVar11 + lVar14 * 4);
            lVar14 = lVar14 + 1;
          } while (uVar8 - uVar16 != (int)lVar14);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != iVar10);
      return 0;
    case 9:
      local_130 = (long)m->c;
      if (local_130 < 1) {
        return 0;
      }
      local_134 = m->h * m->w * m->d * m->elempack;
      auVar47 = vshufps_avx(auVar21,auVar21,0);
      local_a0 = ZEXT1632(auVar47);
      register0x00001210 = auVar47;
      local_c0 = auVar47;
      local_128 = 0;
      do {
        auVar32 = _local_c0;
        pfVar18 = (float *)(local_118->cstep * local_128 * local_118->elemsize +
                           (long)local_118->data);
        pfVar9 = (float *)(local_120->cstep * local_128 * local_120->elemsize +
                          (long)local_120->data);
        local_80[0] = (float)local_c0._0_4_;
        local_80[1] = (float)local_c0._4_4_;
        afStack_78[0] = (float)local_c0._8_4_;
        afStack_78[1] = (float)local_c0._12_4_;
        afStack_70[0] = afStack_b0[0];
        afStack_70[1] = afStack_b0[1];
        afStack_68[0] = afStack_a8[0];
        afStack_68[1] = afStack_a8[1];
        _local_c0 = auVar32;
        if (local_134 < 8) {
          uVar8 = 0;
        }
        else {
          uVar16 = 0;
          do {
            uVar25 = *(undefined8 *)pfVar18;
            uVar24 = *(undefined8 *)(pfVar18 + 2);
            uVar26 = *(undefined8 *)(pfVar18 + 4);
            uVar27 = *(undefined8 *)(pfVar18 + 6);
            local_100 = (float  [2])uVar25;
            afStack_f8 = (float  [2])uVar24;
            afStack_f0 = (float  [2])uVar26;
            afStack_e8._0_8_ = uVar27;
            BinaryOp_x86_avx_functor::binary_op_rpow::func_pack8
                      ((binary_op_rpow *)&local_135,(__m256 *)local_100,(__m256 *)local_80);
            *(undefined8 *)pfVar9 = uVar25;
            *(undefined8 *)(pfVar9 + 2) = uVar24;
            *(undefined8 *)(pfVar9 + 4) = uVar26;
            *(undefined8 *)(pfVar9 + 6) = uVar27;
            pfVar18 = pfVar18 + 8;
            pfVar9 = pfVar9 + 8;
            uVar8 = uVar16 + 8;
            iVar10 = uVar16 + 0xf;
            uVar16 = uVar8;
          } while (iVar10 < local_134);
        }
        auVar32 = local_a0;
        local_100[0] = (float)local_a0._0_4_;
        local_100[1] = (float)local_a0._4_4_;
        afStack_f8[0] = (float)local_a0._8_4_;
        afStack_f8[1] = (float)local_a0._12_4_;
        local_a0 = auVar32;
        uVar16 = uVar8;
        if ((int)(uVar8 | 3) < local_134) {
          do {
            local_110 = *(float (*) [2])pfVar18;
            uVar25 = *(undefined8 *)(pfVar18 + 2);
            afStack_108 = (float  [2])uVar25;
            afVar48 = BinaryOp_x86_avx_functor::binary_op_rpow::func_pack4
                                ((binary_op_rpow *)&local_135,(__m128 *)local_110,
                                 (__m128 *)local_100);
            *(long *)pfVar9 = afVar48._0_8_;
            *(undefined8 *)(pfVar9 + 2) = uVar25;
            pfVar18 = pfVar18 + 4;
            pfVar9 = pfVar9 + 4;
            uVar8 = uVar16 + 4;
            iVar10 = uVar16 + 7;
            uVar16 = uVar8;
          } while (iVar10 < local_134);
        }
        iVar10 = local_134 - uVar8;
        if ((int)uVar8 < local_134) {
          lVar17 = 0;
          do {
            fVar20 = powf((float)local_d0._0_4_,pfVar18[lVar17]);
            pfVar9[lVar17] = fVar20;
            lVar17 = lVar17 + 1;
          } while (iVar10 != (int)lVar17);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_130);
      return 0;
    case 10:
      local_130 = (long)m->c;
      if (local_130 < 1) {
        return 0;
      }
      local_134 = m->h * m->w * m->d * m->elempack;
      auVar47 = vshufps_avx(auVar21,auVar21,0);
      local_a0 = ZEXT1632(auVar47);
      register0x00001210 = auVar47;
      local_c0 = auVar47;
      local_128 = 0;
      do {
        auVar32 = _local_c0;
        pfVar18 = (float *)(local_118->cstep * local_128 * local_118->elemsize +
                           (long)local_118->data);
        pfVar9 = (float *)(local_120->cstep * local_128 * local_120->elemsize +
                          (long)local_120->data);
        local_80[0] = (float)local_c0._0_4_;
        local_80[1] = (float)local_c0._4_4_;
        afStack_78[0] = (float)local_c0._8_4_;
        afStack_78[1] = (float)local_c0._12_4_;
        afStack_70[0] = afStack_b0[0];
        afStack_70[1] = afStack_b0[1];
        afStack_68[0] = afStack_a8[0];
        afStack_68[1] = afStack_a8[1];
        _local_c0 = auVar32;
        if (local_134 < 8) {
          uVar8 = 0;
        }
        else {
          uVar16 = 0;
          do {
            uVar25 = *(undefined8 *)pfVar18;
            uVar24 = *(undefined8 *)(pfVar18 + 2);
            uVar26 = *(undefined8 *)(pfVar18 + 4);
            uVar27 = *(undefined8 *)(pfVar18 + 6);
            local_100 = (float  [2])uVar25;
            afStack_f8 = (float  [2])uVar24;
            afStack_f0 = (float  [2])uVar26;
            afStack_e8._0_8_ = uVar27;
            BinaryOp_x86_avx_functor::binary_op_atan2::func_pack8
                      ((binary_op_atan2 *)&local_135,(__m256 *)local_100,(__m256 *)local_80);
            *(undefined8 *)pfVar9 = uVar25;
            *(undefined8 *)(pfVar9 + 2) = uVar24;
            *(undefined8 *)(pfVar9 + 4) = uVar26;
            *(undefined8 *)(pfVar9 + 6) = uVar27;
            pfVar18 = pfVar18 + 8;
            pfVar9 = pfVar9 + 8;
            uVar8 = uVar16 + 8;
            iVar10 = uVar16 + 0xf;
            uVar16 = uVar8;
          } while (iVar10 < local_134);
        }
        auVar32 = local_a0;
        local_100[0] = (float)local_a0._0_4_;
        local_100[1] = (float)local_a0._4_4_;
        afStack_f8[0] = (float)local_a0._8_4_;
        afStack_f8[1] = (float)local_a0._12_4_;
        local_a0 = auVar32;
        uVar16 = uVar8;
        if ((int)(uVar8 | 3) < local_134) {
          do {
            local_110 = *(float (*) [2])pfVar18;
            uVar25 = *(undefined8 *)(pfVar18 + 2);
            afStack_108 = (float  [2])uVar25;
            afVar48 = BinaryOp_x86_avx_functor::binary_op_atan2::func_pack4
                                ((binary_op_atan2 *)&local_135,(__m128 *)local_110,
                                 (__m128 *)local_100);
            *(long *)pfVar9 = afVar48._0_8_;
            *(undefined8 *)(pfVar9 + 2) = uVar25;
            pfVar18 = pfVar18 + 4;
            pfVar9 = pfVar9 + 4;
            uVar8 = uVar16 + 4;
            iVar10 = uVar16 + 7;
            uVar16 = uVar8;
          } while (iVar10 < local_134);
        }
        iVar10 = local_134 - uVar8;
        if ((int)uVar8 < local_134) {
          lVar17 = 0;
          do {
            fVar20 = atan2f(pfVar18[lVar17],local_d0._0_4_);
            pfVar9[lVar17] = fVar20;
            lVar17 = lVar17 + 1;
          } while (iVar10 != (int)lVar17);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_130);
      return 0;
    case 0xb:
      local_130 = (long)m->c;
      if (local_130 < 1) {
        return 0;
      }
      local_134 = m->h * m->w * m->d * m->elempack;
      auVar47 = vshufps_avx(local_d0,auVar21,0);
      local_a0 = ZEXT1632(auVar47);
      register0x00001210 = auVar47;
      local_c0 = auVar47;
      local_128 = 0;
      do {
        auVar32 = _local_c0;
        pfVar18 = (float *)(local_118->cstep * local_128 * local_118->elemsize +
                           (long)local_118->data);
        pfVar9 = (float *)(local_120->cstep * local_128 * local_120->elemsize +
                          (long)local_120->data);
        local_80[0] = (float)local_c0._0_4_;
        local_80[1] = (float)local_c0._4_4_;
        afStack_78[0] = (float)local_c0._8_4_;
        afStack_78[1] = (float)local_c0._12_4_;
        afStack_70[0] = afStack_b0[0];
        afStack_70[1] = afStack_b0[1];
        afStack_68[0] = afStack_a8[0];
        afStack_68[1] = afStack_a8[1];
        _local_c0 = auVar32;
        if (local_134 < 8) {
          uVar8 = 0;
        }
        else {
          uVar16 = 0;
          do {
            uVar25 = *(undefined8 *)pfVar18;
            uVar24 = *(undefined8 *)(pfVar18 + 2);
            uVar26 = *(undefined8 *)(pfVar18 + 4);
            uVar27 = *(undefined8 *)(pfVar18 + 6);
            local_100 = (float  [2])uVar25;
            afStack_f8 = (float  [2])uVar24;
            afStack_f0 = (float  [2])uVar26;
            afStack_e8._0_8_ = uVar27;
            BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack8
                      (&local_135,(__m256 *)local_100,(__m256 *)local_80);
            *(undefined8 *)pfVar9 = uVar25;
            *(undefined8 *)(pfVar9 + 2) = uVar24;
            *(undefined8 *)(pfVar9 + 4) = uVar26;
            *(undefined8 *)(pfVar9 + 6) = uVar27;
            pfVar18 = pfVar18 + 8;
            pfVar9 = pfVar9 + 8;
            uVar8 = uVar16 + 8;
            iVar10 = uVar16 + 0xf;
            uVar16 = uVar8;
          } while (iVar10 < local_134);
        }
        auVar32 = local_a0;
        local_100[0] = (float)local_a0._0_4_;
        local_100[1] = (float)local_a0._4_4_;
        afStack_f8[0] = (float)local_a0._8_4_;
        afStack_f8[1] = (float)local_a0._12_4_;
        local_a0 = auVar32;
        uVar16 = uVar8;
        if ((int)(uVar8 | 3) < local_134) {
          do {
            local_110 = *(float (*) [2])pfVar18;
            uVar25 = *(undefined8 *)(pfVar18 + 2);
            afStack_108 = (float  [2])uVar25;
            afVar48 = BinaryOp_x86_avx_functor::binary_op_ratan2::func_pack4
                                (&local_135,(__m128 *)local_110,(__m128 *)local_100);
            *(long *)pfVar9 = afVar48._0_8_;
            *(undefined8 *)(pfVar9 + 2) = uVar25;
            pfVar18 = pfVar18 + 4;
            pfVar9 = pfVar9 + 4;
            uVar8 = uVar16 + 4;
            iVar10 = uVar16 + 7;
            uVar16 = uVar8;
          } while (iVar10 < local_134);
        }
        iVar10 = local_134 - uVar8;
        if ((int)uVar8 < local_134) {
          lVar17 = 0;
          do {
            fVar20 = atan2f((float)local_d0._0_4_,pfVar18[lVar17]);
            pfVar9[lVar17] = fVar20;
            lVar17 = lVar17 + 1;
          } while (iVar10 != (int)lVar17);
        }
        local_128 = local_128 + 1;
      } while (local_128 != local_130);
      return 0;
    }
    iVar10 = m->c;
    if ((long)iVar10 < 1) {
      return 0;
    }
    uVar8 = m->h * m->w * m->d * m->elempack;
    auVar47 = vshufps_avx(auVar47,auVar21,0);
    lVar17 = 0;
    do {
      pfVar9 = (float *)(m->cstep * lVar17 * m->elemsize + (long)m->data);
      pauVar11 = (undefined1 (*) [32])
                 (pMVar4->cstep * lVar17 * pMVar4->elemsize + (long)pMVar4->data);
      fVar19 = auVar47._0_4_;
      fVar22 = auVar47._4_4_;
      fVar23 = auVar47._8_4_;
      fVar40 = auVar47._12_4_;
      if ((int)uVar8 < 8) {
        uVar16 = 0;
      }
      else {
        iVar13 = 7;
        do {
          auVar37._0_4_ = fVar19 + *pfVar9;
          auVar37._4_4_ = fVar22 + pfVar9[1];
          auVar37._8_4_ = fVar23 + pfVar9[2];
          auVar37._12_4_ = fVar40 + pfVar9[3];
          auVar37._16_4_ = fVar19 + pfVar9[4];
          auVar37._20_4_ = fVar22 + pfVar9[5];
          auVar37._24_4_ = fVar23 + pfVar9[6];
          auVar37._28_4_ = fVar40 + pfVar9[7];
          *pauVar11 = auVar37;
          pfVar9 = pfVar9 + 8;
          pauVar11 = pauVar11 + 1;
          iVar13 = iVar13 + 8;
          uVar16 = uVar8 & 0xfffffff8;
        } while (iVar13 < (int)uVar8);
      }
      uVar15 = uVar16 | 3;
      while ((int)uVar15 < (int)uVar8) {
        auVar33._0_4_ = fVar19 + *pfVar9;
        auVar33._4_4_ = fVar22 + pfVar9[1];
        auVar33._8_4_ = fVar23 + pfVar9[2];
        auVar33._12_4_ = fVar40 + pfVar9[3];
        *(undefined1 (*) [16])*pauVar11 = auVar33;
        pfVar9 = pfVar9 + 4;
        pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 0x10);
        uVar15 = uVar16 + 7;
        uVar16 = uVar16 + 4;
      }
      if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
        lVar14 = 0;
        do {
          *(float *)((long)*pauVar11 + lVar14 * 4) = fVar20 + pfVar9[lVar14];
          lVar14 = lVar14 + 1;
        } while (uVar8 - uVar16 != (int)lVar14);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != iVar10);
    return 0;
  }
  iVar2 = m->dims;
  iVar3 = b->dims;
  if ((((iVar2 == iVar3) && (m->w == uVar15)) &&
      ((m->h == iVar10 && ((m->d == iVar13 && (m->c == iVar1)))))) && (m->elempack == uVar16)) {
    binary_op_no_broadcast(m,b,pMVar4,uVar8,opt_00);
    return 0;
  }
  if (iVar3 < iVar2) {
LAB_003aa853:
    binary_op_broadcast_inner(m,b,pMVar4,uVar8,opt_00);
    return 0;
  }
  if (iVar2 == 2) {
    if ((uVar15 == 1) && (iVar10 == m->h)) goto LAB_003aa853;
LAB_003aa8bf:
    bVar7 = false;
LAB_003aa8c2:
    bVar6 = false;
  }
  else {
    if (iVar2 == 4) {
      bVar7 = true;
      if ((uVar15 == 1) &&
         (((iVar10 == 1 &&
           (((iVar13 == 1 && (iVar1 == m->c)) || ((iVar13 == m->d && (iVar1 == m->c)))))) ||
          (((iVar10 == m->h && (iVar13 == m->d)) && (iVar1 == m->c)))))) goto LAB_003aa853;
      goto LAB_003aa8c2;
    }
    if (iVar2 != 3) goto LAB_003aa8bf;
    bVar6 = true;
    if ((uVar15 == 1) &&
       (((iVar10 == 1 && (iVar1 == m->c)) || ((iVar10 == m->h && (iVar1 == m->c))))))
    goto LAB_003aa853;
    bVar7 = false;
  }
  if (uVar16 == 1) {
    if (((iVar2 == 2) && (iVar10 == 1)) && (uVar15 == m->w)) {
LAB_003aa937:
      binary_op_broadcast_outer(m,b,pMVar4,uVar8,opt_00);
      return 0;
    }
    if (bVar6) {
      uVar16 = m->w;
      opt_00 = (Option *)(ulong)uVar16;
      if ((((iVar1 == 1) && (iVar10 == 1)) && (uVar15 == uVar16)) ||
         (((uVar15 == uVar16 && (iVar1 == 1)) && (iVar10 == m->h)))) goto LAB_003aa937;
    }
    if (bVar7) {
      uVar16 = m->w;
      opt_00 = (Option *)(ulong)uVar16;
      if (((((iVar1 == 1) && (iVar13 == 1)) && (iVar10 == 1)) && (uVar15 == uVar16)) ||
         ((uVar15 == uVar16 &&
          ((((iVar1 == 1 && (iVar13 == 1)) && (iVar10 == m->h)) ||
           (((iVar10 == m->h && (iVar1 == 1)) && (iVar13 == m->d)))))))) goto LAB_003aa937;
    }
  }
  if (!bVar6 || iVar3 != 3) {
    return 0;
  }
  if (iVar10 != 1) {
    return 0;
  }
  if (m->w != uVar15) {
    return 0;
  }
  if (m->c != iVar1) {
    return 0;
  }
  binary_op_broadcast_20(m,b,pMVar4,uVar8,opt_00);
  return 0;
}

Assistant:

int BinaryOp_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const bool b_is_scalar = bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack == 1;
    const bool a_rank_is_lower = bottom_blobs[0].dims < bottom_blobs[1].dims && !b_is_scalar;
    const bool a_size_is_lower = bottom_blobs[0].w * bottom_blobs[0].h * bottom_blobs[0].d * bottom_blobs[0].c * bottom_blobs[0].elempack < bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack;
    const bool a_is_lower = a_rank_is_lower || (!a_rank_is_lower && a_size_is_lower);
    const Mat& A = a_is_lower ? bottom_blobs[1] : bottom_blobs[0];
    const Mat& B = a_is_lower ? bottom_blobs[0] : bottom_blobs[1];
    const int op_type_r = a_is_lower ? get_reverse_op_type(op_type) : op_type;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(A, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // B is a scalar
    if (B.w * B.h * B.d * B.c * B.elempack == 1)
    {
        return binary_op_scalar(A, B[0], top_blob, op_type_r, opt);
    }

    // no broadcast
    if (A.dims == B.dims && A.w == B.w && A.h == B.h && A.d == B.d && A.c == B.c && A.elempack == B.elempack)
    {
        return binary_op_no_broadcast(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for inner axis
    if ((B.dims < A.dims)
            || (A.dims == 2 && B.w == 1 && B.h == A.h)
            || (A.dims == 3 && B.w == 1 && B.h == 1 && B.c == A.c)
            || (A.dims == 3 && B.w == 1 && B.h == A.h && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == 1 && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == A.d && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == A.h && B.d == A.d && B.c == A.c))
    {
        return binary_op_broadcast_inner(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for outer axis
    if (B.elempack == 1 && ((A.dims == 2 && B.w == A.w && B.h == 1) || (A.dims == 3 && B.w == A.w && B.h == 1 && B.c == 1) || (A.dims == 3 && B.w == A.w && B.h == A.h && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == 1 && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == A.d && B.c == 1)))
    {
        return binary_op_broadcast_outer(A, B, top_blob, op_type_r, opt);
    }

    // some special broadcast rule here
    if (A.dims == 3 && B.dims == 3 && A.w == B.w && B.h == 1 && A.c == B.c)
    {
        return binary_op_broadcast_20(A, B, top_blob, op_type_r, opt);
    }

    return 0;
}